

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

UniValue * __thiscall
GenerateToAddressRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,GenerateToAddressRequestHandler *this,UniValue *reply)

{
  long lVar1;
  UniValue result_00;
  UniValue val;
  UniValue val_00;
  UniValue error;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffd38;
  undefined1 auVar3 [32];
  undefined1 in_stack_fffffffffffffd58 [56];
  undefined1 in_stack_fffffffffffffd90 [32];
  undefined1 in_stack_fffffffffffffdb0 [56];
  _Optional_payload_base<UniValue> in_stack_fffffffffffffde8;
  string local_1b0;
  UniValue local_190;
  string local_138 [32];
  UniValue local_118;
  string local_c0 [32];
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  UniValue result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  UniValue::UniValue(&result,VOBJ,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"address",(allocator<char> *)&local_1b0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_118,&this->address_str);
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd90._0_8_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
       = (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd90._8_24_;
  auVar3 = in_stack_fffffffffffffd58._8_32_;
  val.typ = in_stack_fffffffffffffd58._0_4_;
  val._4_4_ = in_stack_fffffffffffffd58._4_4_;
  val.val._M_dataplus._M_p = (pointer)auVar3._0_8_;
  val.val._M_string_length = auVar3._8_8_;
  val.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar3._16_16_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd58._40_8_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd58._48_8_;
  UniValue::pushKV(&result,in_stack_fffffffffffffd38,val);
  UniValue::~UniValue(&local_118);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"blocks",(allocator<char> *)&stack0xfffffffffffffd3f);
  pUVar2 = UniValue::get_obj(reply);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"result",(allocator<char> *)&stack0xfffffffffffffd3e);
  pUVar2 = UniValue::operator[](pUVar2,&local_1b0);
  UniValue::UniValue(&local_190,pUVar2);
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd90._0_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd90._8_24_;
  auVar3 = in_stack_fffffffffffffd58._8_32_;
  val_00.typ = in_stack_fffffffffffffd58._0_4_;
  val_00._4_4_ = in_stack_fffffffffffffd58._4_4_;
  val_00.val._M_dataplus._M_p = (pointer)auVar3._0_8_;
  val_00.val._M_string_length = auVar3._8_8_;
  val_00.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar3._16_16_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd58._40_8_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd58._48_8_;
  UniValue::pushKV(&result,in_stack_fffffffffffffd38,val_00);
  UniValue::~UniValue(&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string(local_138);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffdf8,&result);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffda0,&NullUniValue);
  local_1b0._M_dataplus._M_p._0_4_ = 1;
  std::_Optional_payload_base<UniValue>::_Optional_payload_base<int>
            ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffd40);
  result_00._32_56_ = in_stack_fffffffffffffd58;
  result_00._0_32_ = in_stack_fffffffffffffd38;
  error._32_56_ = in_stack_fffffffffffffdb0;
  error._0_32_ = in_stack_fffffffffffffd90;
  JSONRPCReplyObj(__return_storage_ptr__,result_00,error,
                  (optional<UniValue>)in_stack_fffffffffffffde8,
                  (JSONRPCVersion)&stack0xfffffffffffffdf8);
  std::_Optional_payload_base<UniValue>::_M_reset
            ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffd40);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffda0);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffdf8);
  UniValue::~UniValue(&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ProcessReply(const UniValue &reply) override
    {
        UniValue result(UniValue::VOBJ);
        result.pushKV("address", address_str);
        result.pushKV("blocks", reply.get_obj()["result"]);
        return JSONRPCReplyObj(std::move(result), NullUniValue, /*id=*/1, JSONRPCVersion::V2);
    }